

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  int iVar1;
  uint8_t *in_RCX;
  st_ptls_record_t *in_RDX;
  ptls_t *in_RSI;
  ptls_t *in_RDI;
  size_t *in_R8;
  st_ptls_traffic_protection_t *in_R9;
  _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
  *unaff_retaddr;
  size_t decrypted_length;
  int ret;
  st_ptls_record_t rec;
  size_t in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  size_t *in_stack_ffffffffffffffb8;
  ptls_buffer_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = parse_record(in_RSI,in_RDX,in_RCX,in_R8);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_stack_ffffffffffffffc0 == (ptls_buffer_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x1288,
                  "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (in_stack_ffffffffffffffb0 == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < in_RDI->state) {
      return 0x28;
    }
    if ((in_stack_ffffffffffffffb8 != (size_t *)0x1) ||
       (*(uint8_t *)&in_stack_ffffffffffffffc0->base != '\x01')) {
      return 0x2f;
    }
    iVar1 = 0x202;
    goto LAB_00110301;
  }
  if (((in_RDI->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0) ||
     (in_stack_ffffffffffffffb0 == '\x15')) {
    if ((in_stack_ffffffffffffffb0 != '\x17') ||
       (((in_RDI->field_0x160 & 1) == 0 ||
        ((in_RDI->field_18).server.early_data_skipped_bytes == 0xffffffff)))) goto LAB_001101f6;
  }
  else {
    if (in_stack_ffffffffffffffb0 != '\x17') {
      return 0x28;
    }
    iVar1 = ptls_buffer_reserve((ptls_buffer_t *)(ulong)in_stack_ffffffffffffffa8,
                                in_stack_ffffffffffffffa0);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = aead_decrypt(in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (void *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                         (ulong)in_stack_ffffffffffffffa8);
    if (iVar1 == 0) {
      in_stack_ffffffffffffffc0 = (ptls_buffer_t *)(in_RDX->fragment + *(long *)in_RDX);
      for (; (in_stack_ffffffffffffffa0 != 0 &&
             (*(uint8_t *)((long)in_stack_ffffffffffffffc0 + (in_stack_ffffffffffffffa0 - 1)) ==
              '\0')); in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 - 1) {
      }
      if (in_stack_ffffffffffffffa0 == 0) {
        return 10;
      }
      in_stack_ffffffffffffffb8 = (size_t *)(in_stack_ffffffffffffffa0 - 1);
      in_stack_ffffffffffffffb0 =
           *(uint8_t *)((long)in_stack_ffffffffffffffc0 + (in_stack_ffffffffffffffa0 - 1));
LAB_001101f6:
      if (((in_RDI->recvbuf).mess.base == (uint8_t *)0x0) && (in_stack_ffffffffffffffb0 != '\x16'))
      {
        if (in_stack_ffffffffffffffb0 == '\x15') {
          iVar1 = handle_alert(in_RDI,(uint8_t *)in_stack_ffffffffffffffc0,
                               (size_t)in_stack_ffffffffffffffb8);
        }
        else if (in_stack_ffffffffffffffb0 == '\x17') {
          if (in_RDI->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if (in_RDI->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
              if ((in_RDI->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
                in_RDX->fragment =
                     (uint8_t *)((long)in_stack_ffffffffffffffb8 + (long)in_RDX->fragment);
              }
              iVar1 = 0;
            }
            else {
              iVar1 = 10;
            }
          }
          else {
            in_RDX->fragment = (uint8_t *)((long)in_stack_ffffffffffffffb8 + (long)in_RDX->fragment)
            ;
            iVar1 = 0;
          }
        }
        else {
          iVar1 = 10;
        }
      }
      else {
        iVar1 = handle_handshake_record
                          ((ptls_t *)decrypted_length,unaff_retaddr,
                           (ptls_message_emitter_t *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (st_ptls_record_t *)in_RDI,(ptls_handshake_properties_t *)in_RSI);
      }
      goto LAB_00110301;
    }
    if ((in_RDI->field_0x160 & 1) == 0) {
      return iVar1;
    }
    if ((in_RDI->field_18).server.early_data_skipped_bytes == 0xffffffff) {
      return iVar1;
    }
  }
  (in_RDI->field_18).server.early_data_skipped_bytes =
       (int)in_stack_ffffffffffffffb8 + (in_RDI->field_18).server.early_data_skipped_bytes;
  if (0x10000 < (in_RDI->field_18).server.early_data_skipped_bytes) {
    return 0x28;
  }
  iVar1 = 0x202;
LAB_00110301:
  ptls_buffer_dispose(in_stack_ffffffffffffffc0);
  return iVar1;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}